

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void adjuststack(luaL_Buffer *B)

{
  int iVar1;
  int iVar2;
  lua_State *L_00;
  lua_State *plVar3;
  lua_State *in_RDI;
  size_t l;
  size_t toplen;
  int toget;
  lua_State *L;
  int local_14;
  StkId pTVar4;
  
  iVar2._0_1_ = in_RDI->tt;
  iVar2._1_1_ = in_RDI->marked;
  iVar2._2_1_ = in_RDI->status;
  iVar2._3_1_ = in_RDI->field_0xb;
  if (1 < iVar2) {
    pTVar4 = in_RDI->top;
    local_14 = 1;
    L_00 = (lua_State *)lua_objlen(in_RDI,(int)((ulong)pTVar4 >> 0x20));
    do {
      plVar3 = (lua_State *)lua_objlen(in_RDI,(int)((ulong)pTVar4 >> 0x20));
      if (((*(int *)&in_RDI->tt - local_14) + 1 < 10) && (L_00 <= plVar3)) break;
      L_00 = (lua_State *)((long)&L_00->next + (long)&plVar3->next);
      local_14 = local_14 + 1;
      iVar1._0_1_ = in_RDI->tt;
      iVar1._1_1_ = in_RDI->marked;
      iVar1._2_1_ = in_RDI->status;
      iVar1._3_1_ = in_RDI->field_0xb;
    } while (local_14 < iVar1);
    lua_concat(L_00,(int)((ulong)plVar3 >> 0x20));
    *(int *)&in_RDI->tt = (*(int *)&in_RDI->tt - local_14) + 1;
  }
  return;
}

Assistant:

static void adjuststack(luaL_Buffer*B){
if(B->lvl>1){
lua_State*L=B->L;
int toget=1;
size_t toplen=lua_strlen(L,-1);
do{
size_t l=lua_strlen(L,-(toget+1));
if(B->lvl-toget+1>=(20/2)||toplen>l){
toplen+=l;
toget++;
}
else break;
}while(toget<B->lvl);
lua_concat(L,toget);
B->lvl=B->lvl-toget+1;
}
}